

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

bool operator<(sockaddr_in *addr,sockaddr_in *addr2)

{
  sockaddr_in *addr2_local;
  sockaddr_in *addr_local;
  
  if (addr->sin_family == addr2->sin_family) {
    if ((addr->sin_addr).s_addr == (addr2->sin_addr).s_addr) {
      if (addr->sin_port == addr2->sin_port) {
        addr_local._7_1_ = false;
      }
      else {
        addr_local._7_1_ = addr->sin_port < addr2->sin_port;
      }
    }
    else {
      addr_local._7_1_ = (addr->sin_addr).s_addr < (addr2->sin_addr).s_addr;
    }
  }
  else {
    addr_local._7_1_ = addr->sin_family < addr2->sin_family;
  }
  return addr_local._7_1_;
}

Assistant:

bool operator<(const struct sockaddr_in &addr, const struct sockaddr_in &addr2) {
	if (addr.sin_family != addr2.sin_family)
		return (addr.sin_family < addr2.sin_family);
	if (addr.sin_addr.s_addr != addr2.sin_addr.s_addr)
		return (addr.sin_addr.s_addr < addr2.sin_addr.s_addr);
	if (addr.sin_port != addr2.sin_port)
		return (addr.sin_port < addr2.sin_port);
	return false;
}